

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pi-seq.c
# Opt level: O1

int main(int argc,char **argv)

{
  __time_t _Var1;
  long lVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  long lVar7;
  uint uVar8;
  double dVar9;
  double dVar10;
  undefined1 auVar11 [16];
  timespec tv;
  timespec local_40;
  
  if (1 < argc) {
    lVar4 = atol(argv[1]);
    clock_gettime(1,&local_40);
    lVar2 = local_40.tv_nsec;
    _Var1 = local_40.tv_sec;
    if (lVar4 == 0) {
      dVar10 = 0.0;
    }
    else {
      uVar8 = 0x12d591;
      lVar7 = 0;
      lVar6 = lVar4;
      do {
        uVar5 = (uVar8 * 0x41c64e6d + 0x3039) / 0x7fffffff;
        dVar9 = (double)(int)(uVar8 * 0x41c64e6d + (uVar5 << 0x1f | uVar5) + 0x3039) / 2147483647.0;
        iVar3 = uVar8 * -0x3d5d6597;
        uVar8 = iVar3 + 0xd3dc167e;
        dVar10 = (double)(int)(iVar3 + (uVar8 / 0x7fffffff << 0x1f | uVar8 / 0x7fffffff) +
                              -0x2c23e982) / 2147483647.0;
        dVar10 = dVar9 * dVar9 + dVar10 * dVar10;
        if (dVar10 < 0.0) {
          dVar10 = sqrt(dVar10);
        }
        else {
          dVar10 = SQRT(dVar10);
        }
        lVar6 = lVar6 + -1;
        lVar7 = lVar7 + (ulong)(dVar10 < 1.0);
      } while (lVar6 != 0);
      auVar11._8_4_ = (int)((ulong)lVar7 >> 0x20);
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = 0x45300000;
      dVar10 = ((auVar11._8_8_ - 1.9342813113834067e+25) +
               ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * 4.0;
    }
    clock_gettime(1,&local_40);
    printf("pi(%ld) = %.12lf (accuracy: %.12lf)\n",dVar10 / (double)lVar4,
           SUB84(ABS(3.141592653589793 - dVar10 / (double)lVar4) / 3.141592653589793,0),lVar4);
    printf("Time: %f\n",
           ((double)local_40.tv_nsec * 1e-09 + (double)local_40.tv_sec) -
           ((double)lVar2 * 1e-09 + (double)_Var1));
    return 0;
  }
  main_cold_1();
  halt_baddata();
}

Assistant:

int main(int argc, char **argv)
{
    if (argc <= 1) {
        usage(argv[0]);
        exit(1);
    }

    const long n = atol(argv[1]);

    double x, y;
    uint64_t count = 0;
    unsigned int seed = 1234321;
    long m = n;

    double t1 = wctime();
    while (m--) {
        x = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        y = rng(&seed, RAND_MAX)/(double)RAND_MAX;
        if (sqrt(x*x+y*y) < 1.0) ++count;
    }
    double pi = 4.0*(double)count/n;
    double t2 = wctime();

    printf("pi(%ld) = %.12lf (accuracy: %.12lf)\n", n, pi, fabs(M_PI-pi)/M_PI);
    printf("Time: %f\n", t2-t1);

    return 0;
}